

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromDarChoices(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  Abc_Aig_t *pMan_00;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  Abc_Ntk_t *pAVar6;
  
  if (pMan->pEquivs == (Aig_Obj_t **)0x0) {
    __assert_fail("pMan->pEquivs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x460,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
  }
  if (pMan->nObjs[4] == 0) {
    pNtk = Abc_NtkStartFrom(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
    pNtk->nConstrs = pMan->nConstrs;
    pNtk->nBarBufs = pNtkOld->nBarBufs;
    Aig_ManCleanData(pMan);
    pAVar1 = Abc_AigConst1(pNtk);
    (pMan->pConst1->field_5).pData = pAVar1;
    for (iVar5 = 0; iVar5 < pMan->vCis->nSize; iVar5 = iVar5 + 1) {
      pvVar2 = Vec_PtrEntry(pMan->vCis,iVar5);
      pAVar1 = Abc_NtkCi(pNtk,iVar5);
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar1;
    }
    iVar5 = 0;
    do {
      if (pMan->vObjs->nSize <= iVar5) {
        for (iVar5 = 0; iVar5 < pMan->vCos->nSize; iVar5 = iVar5 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,iVar5);
          pAVar1 = Abc_NtkCo(pNtk,iVar5);
          pAVar4 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
          Abc_ObjAddFanin(pAVar1,pAVar4);
        }
        pAVar6 = pNtk;
        iVar5 = Abc_NtkCheck(pNtk);
        if (iVar5 == 0) {
          Abc_Print((int)pAVar6,"Abc_NtkFromDar(): Network check has failed.\n");
        }
        return pNtk;
      }
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vObjs,iVar5);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
        pAVar1 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
        pAVar4 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar3);
        pAVar1 = Abc_AigAnd(pMan_00,pAVar1,pAVar4);
        (pAVar3->field_5).pData = pAVar1;
        if ((pMan->pEquivs != (Aig_Obj_t **)0x0) &&
           (pAVar3 = pMan->pEquivs[pAVar3->Id], pAVar3 != (Aig_Obj_t *)0x0)) {
          pvVar2 = (pAVar3->field_5).pData;
          if (pvVar2 == (void *)0x0) {
            __assert_fail("pTemp->pData != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                          ,0x471,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
          }
          (pAVar1->field_5).pData = pvVar2;
        }
      }
      iVar5 = iVar5 + 1;
    } while( true );
  }
  __assert_fail("Aig_ManBufNum(pMan) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                ,0x461,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDarChoices( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Abc_Ntk_t * pNtkNew;
    Aig_Obj_t * pObj, * pTemp;
    int i;
    assert( pMan->pEquivs != NULL );
    assert( Aig_ManBufNum(pMan) == 0 );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pNtkOld->nBarBufs;
    // transfer the pointers to the basic nodes
    Aig_ManCleanData( pMan );
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pData = Abc_NtkCi(pNtkNew, i);
    // rebuild the AIG
    Aig_ManForEachNode( pMan, pObj, i )
    {
        pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
        if ( (pTemp = Aig_ObjEquiv(pMan, pObj)) )
        {
            assert( pTemp->pData != NULL );
            ((Abc_Obj_t *)pObj->pData)->pData = ((Abc_Obj_t *)pTemp->pData);
        }
    }
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), (Abc_Obj_t *)Aig_ObjChild0Copy(pObj) );
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );

    // verify topological order
    if ( 0 )
    {
        Abc_Obj_t * pNode;
        Abc_NtkForEachNode( pNtkNew, pNode, i )
            if ( Abc_AigNodeIsChoice( pNode ) )
            {
                int Counter = 0;
                for ( pNode = Abc_ObjEquiv(pNode); pNode; pNode = Abc_ObjEquiv(pNode) )
                    Counter++;
                printf( "%d ", Counter );
            }
        printf( "\n" );
    }
    return pNtkNew;
}